

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcher.cpp
# Opt level: O2

void __thiscall
cbtCollisionDispatcher::clearManifold(cbtCollisionDispatcher *this,cbtPersistentManifold *manifold)

{
  cbtPersistentManifold::clearManifold(manifold);
  return;
}

Assistant:

void cbtCollisionDispatcher::clearManifold(cbtPersistentManifold* manifold)
{
	manifold->clearManifold();
}